

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O3

_Bool htable_add(htable *ht,size_t hash,void *p)

{
  undefined1 auVar1 [16];
  uintptr_t *puVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uintptr_t *puVar6;
  size_t sVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  void *pvVar12;
  ulong uVar13;
  size_t start;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  
  uVar14 = ht->elems + 1;
  if (ht->max < uVar14) {
    uVar5 = ht->bits;
    puVar2 = ht->table;
    uVar10 = uVar5 + 1;
    bVar9 = (byte)uVar10;
    puVar6 = (uintptr_t *)calloc((long)(1 << (bVar9 & 0x1f)),8);
    ht->table = puVar6;
    if (puVar6 == (uintptr_t *)0x0) {
      ht->table = puVar2;
      return false;
    }
    ht->bits = uVar10;
    ht->max = (ulong)(3L << (bVar9 & 0x3f)) >> 2;
    ht->max_with_deleted = (ulong)(9L << (bVar9 & 0x3f)) / 10;
    if ((ht->perfect_bit == 0) && (ht->common_mask != 0)) {
      uVar8 = 0;
      do {
        if ((ht->common_mask >> (uVar8 & 0x3f) & 1) != 0) {
          ht->perfect_bit = 1L << ((byte)uVar8 & 0x3f);
          break;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != 0x40);
    }
    if (puVar2 != &ht->perfect_bit) {
      uVar14 = 0;
      uVar8 = 1;
      do {
        if (1 < puVar2[uVar14]) {
          pvVar12 = (void *)(puVar2[uVar14] & ~ht->common_mask | ht->common_bits);
          sVar7 = (*ht->rehash)(pvVar12,ht->priv);
          ht_add(ht,pvVar12,sVar7);
        }
        uVar11 = uVar8 >> ((byte)uVar5 & 0x3f);
        uVar14 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (uVar11 == 0);
      free(puVar2);
      uVar14 = ht->elems + 1;
    }
    ht->deleted = 0;
    sVar7 = 0;
  }
  else {
    sVar7 = ht->deleted;
  }
  if (ht->max_with_deleted < uVar14 + sVar7) {
    lVar15 = 0;
    do {
      puVar2 = ht->table + lVar15;
      lVar15 = lVar15 + 1;
    } while (*puVar2 != 0);
    uVar10 = ht->bits;
    uVar14 = 1;
    do {
      uVar5 = ~(-1 << ((byte)uVar10 & 0x1f)) & ((int)lVar15 + (int)uVar14) - 2U;
      puVar2 = ht->table;
      uVar8 = puVar2[uVar5];
      if (uVar8 != 0) {
        if (uVar8 == 1) {
          puVar2[uVar5] = 0;
        }
        else if ((ht->perfect_bit & uVar8) == 0) {
          pvVar12 = (void *)(uVar8 & ~ht->common_mask | ht->common_bits);
          puVar2[uVar5] = 0;
          sVar7 = (*ht->rehash)(pvVar12,ht->priv);
          ht_add(ht,pvVar12,sVar7);
          uVar10 = ht->bits;
        }
      }
      uVar8 = uVar14 >> ((byte)uVar10 & 0x3f);
      uVar14 = uVar14 + 1;
    } while (uVar8 == 0);
    ht->deleted = 0;
  }
  if (p == (void *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/stricaud[P]faup/src/lib/hash/htable.c"
                  ,0x109,"_Bool htable_add(struct htable *, size_t, const void *)");
  }
  uVar8 = ht->common_mask & (ulong)p;
  uVar14 = ht->common_bits;
  if (uVar8 != uVar14) {
    if (ht->elems == 0) {
      uVar14 = 0x3f;
      do {
        if (((ulong)p >> (uVar14 & 0x3f) & 1) != 0) goto LAB_00114be4;
        uVar10 = (int)uVar14 - 1;
        uVar14 = (ulong)uVar10;
      } while (uVar10 != 0);
      uVar14 = 0;
LAB_00114be4:
      bVar9 = (byte)uVar14 & 0x3f;
      ht->common_mask = -2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9;
      ht->common_bits = (ulong)p & ~(1L << (uVar14 & 0x3f));
      ht->perfect_bit = 1;
    }
    else {
      uVar8 = uVar8 ^ uVar14;
      uVar10 = ht->bits;
      puVar2 = ht->table;
      uVar11 = ~uVar8;
      uVar5 = 1;
      uVar13 = 0;
      do {
        uVar3 = puVar2[uVar13];
        if (1 < uVar3) {
          puVar2[uVar13] = uVar3 & uVar11 | uVar14 & uVar8;
        }
        uVar13 = (ulong)uVar5;
        uVar4 = uVar5 >> ((byte)uVar10 & 0x3f);
        uVar5 = uVar5 + 1;
      } while (uVar4 == 0);
      auVar1._0_8_ = ht->common_mask;
      auVar1._8_8_ = ht->common_bits;
      auVar16._8_4_ = (int)uVar11;
      auVar16._0_8_ = uVar11;
      auVar16._12_4_ = (int)(uVar11 >> 0x20);
      ht->common_mask = SUB168(auVar16 & auVar1,0);
      ht->common_bits = SUB168(auVar16 & auVar1,8);
      ht->perfect_bit = ht->perfect_bit & uVar11;
    }
  }
  ht_add(ht,p,hash);
  ht->elems = ht->elems + 1;
  return true;
}

Assistant:

bool htable_add(struct htable *ht, size_t hash, const void *p)
{
	if (ht->elems+1 > ht->max && !double_table(ht))
		return false;
	if (ht->elems+1 + ht->deleted > ht->max_with_deleted)
		rehash_table(ht);
	assert(p);
	if (((uintptr_t)p & ht->common_mask) != ht->common_bits)
		update_common(ht, p);

	ht_add(ht, p, hash);
	ht->elems++;
	return true;
}